

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weightedgraph.cpp
# Opt level: O2

ostream * libDAI::operator<<(ostream *os,DEdgeVec *rt)

{
  pointer pDVar1;
  ostream *poVar2;
  long lVar3;
  size_t n;
  ulong uVar4;
  
  std::operator<<(os,"[");
  lVar3 = 0;
  for (uVar4 = 0;
      pDVar1 = (rt->super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(rt->super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)pDVar1 >> 4);
      uVar4 = uVar4 + 1) {
    poVar2 = operator<<(os,(DEdge *)((long)&pDVar1->n1 + lVar3));
    std::operator<<(poVar2,", ");
    lVar3 = lVar3 + 0x10;
  }
  std::operator<<(os,"]");
  return os;
}

Assistant:

std::ostream & operator << (std::ostream & os, const DEdgeVec & rt) {
        os << "[";
        for( size_t n = 0; n < rt.size(); n++ )
            os << rt[n] << ", ";
        os << "]";
        return os;
    }